

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

BBox3fa * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)1,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,LinearSpace3fa *space,size_t i)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  uint uVar18;
  long lVar19;
  float fVar20;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar27;
  uint uVar28;
  float fVar35;
  uint uVar36;
  float fVar37;
  uint uVar38;
  float fVar39;
  uint uVar40;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar57;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  undefined1 auVar76 [16];
  float fVar77;
  float fVar78;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar85;
  uint uVar86;
  float fVar92;
  uint uVar93;
  float fVar94;
  uint uVar95;
  uint uVar96;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar97;
  float fVar99;
  float fVar100;
  undefined1 auVar98 [16];
  float fVar101;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar102 [16];
  float fVar106;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar107 [16];
  float fVar111;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar112 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  undefined1 local_1c8 [16];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint local_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar18 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                               super_CurveGeometry.super_Geometry.field_0x58 +
                    i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>)
                                  .super_CurveGeometry.field_0x68);
  pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  pfVar1 = (float *)(pcVar7 + sVar8 * uVar18);
  fVar105 = *pfVar1;
  fVar75 = pfVar1[1];
  fVar77 = pfVar1[2];
  pfVar2 = (float *)(pcVar7 + sVar8 * (uVar18 + 1));
  fVar100 = *pfVar2;
  fVar101 = pfVar2[1];
  fVar103 = pfVar2[2];
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  pfVar3 = (float *)(pcVar7 + uVar18 * sVar8);
  fVar104 = *pfVar3;
  fVar109 = pfVar3[1];
  fVar110 = pfVar3[2];
  pfVar4 = (float *)(pcVar7 + sVar8 * (uVar18 + 1));
  fVar57 = *pfVar4;
  fVar61 = pfVar4[1];
  fVar62 = pfVar4[2];
  fVar63 = (space->vx).field_0.m128[0];
  fVar65 = (space->vx).field_0.m128[1];
  fVar70 = (space->vx).field_0.m128[2];
  fVar71 = (space->vy).field_0.m128[0];
  fVar72 = (space->vy).field_0.m128[1];
  fVar9 = (space->vy).field_0.m128[2];
  fVar10 = (space->vz).field_0.m128[0];
  fVar11 = (space->vz).field_0.m128[1];
  fVar12 = (space->vz).field_0.m128[2];
  fVar85 = fVar105 * fVar63 + fVar75 * fVar71 + fVar77 * fVar10;
  fVar92 = fVar105 * fVar65 + fVar75 * fVar72 + fVar77 * fVar11;
  fVar94 = fVar105 * fVar70 + fVar75 * fVar9 + fVar77 * fVar12;
  fVar105 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
            maxRadiusScale;
  fVar75 = pfVar1[3] * fVar105;
  fVar97 = fVar100 * fVar63 + fVar101 * fVar71 + fVar103 * fVar10;
  fVar99 = fVar100 * fVar65 + fVar101 * fVar72 + fVar103 * fVar11;
  fVar100 = fVar100 * fVar70 + fVar101 * fVar9 + fVar103 * fVar12;
  fVar77 = pfVar2[3] * fVar105;
  fVar106 = (fVar104 * fVar63 + fVar109 * fVar71 + fVar110 * fVar10) * 0.33333334 + fVar85;
  fVar108 = (fVar104 * fVar65 + fVar109 * fVar72 + fVar110 * fVar11) * 0.33333334 + fVar92;
  fVar109 = (fVar104 * fVar70 + fVar109 * fVar9 + fVar110 * fVar12) * 0.33333334 + fVar94;
  fVar110 = pfVar3[3] * fVar105 * 0.33333334 + fVar75;
  fVar101 = fVar97 - (fVar57 * fVar63 + fVar61 * fVar71 + fVar62 * fVar10) * 0.33333334;
  fVar103 = fVar99 - (fVar57 * fVar65 + fVar61 * fVar72 + fVar62 * fVar11) * 0.33333334;
  fVar104 = fVar100 - (fVar57 * fVar70 + fVar61 * fVar9 + fVar62 * fVar12) * 0.33333334;
  fVar105 = fVar77 - pfVar4[3] * fVar105 * 0.33333334;
  lVar19 = 0;
  local_1d8 = 0x7f800000;
  uStack_1d4 = 0x7f800000;
  uStack_1d0 = 0x7f800000;
  uStack_1cc = 0x7f800000;
  local_1e8._8_8_ = 0x7f8000007f800000;
  local_1e8._0_8_ = 0x7f8000007f800000;
  local_1b8 = 0x7f800000;
  uStack_1b4 = 0x7f800000;
  uStack_1b0 = 0x7f800000;
  uStack_1ac = 0x7f800000;
  local_218._8_8_ = 0x7f8000007f800000;
  local_218._0_8_ = 0x7f8000007f800000;
  local_1c8 = _DAT_01feba00;
  local_1f8 = _DAT_01feba00;
  local_208 = _DAT_01feba00;
  auVar98 = _DAT_01feba00;
  do {
    uVar18 = (uint)lVar19;
    lVar5 = lVar19 * 4;
    fVar57 = *(float *)(bezier_basis0 + lVar5 + 0x1dc);
    fVar61 = *(float *)(bezier_basis0 + lVar5 + 0x1e0);
    fVar62 = *(float *)(bezier_basis0 + lVar5 + 0x1e4);
    fVar63 = *(float *)(bezier_basis0 + lVar5 + 0x1e8);
    lVar5 = lVar19 * 4;
    fVar65 = *(float *)(bezier_basis0 + lVar5 + 0x660);
    fVar70 = *(float *)(bezier_basis0 + lVar5 + 0x664);
    fVar71 = *(float *)(bezier_basis0 + lVar5 + 0x668);
    fVar72 = *(float *)(bezier_basis0 + lVar5 + 0x66c);
    lVar5 = lVar19 * 4;
    fVar9 = *(float *)(bezier_basis0 + lVar5 + 0xae4);
    fVar10 = *(float *)(bezier_basis0 + lVar5 + 0xae8);
    fVar11 = *(float *)(bezier_basis0 + lVar5 + 0xaec);
    fVar12 = *(float *)(bezier_basis0 + lVar5 + 0xaf0);
    lVar5 = lVar19 * 4;
    fVar13 = *(float *)(bezier_basis0 + lVar5 + 0xf68);
    fVar14 = *(float *)(bezier_basis0 + lVar5 + 0xf6c);
    fVar15 = *(float *)(bezier_basis0 + lVar5 + 0xf70);
    fVar16 = *(float *)(bezier_basis0 + lVar5 + 0xf74);
    auVar68._0_4_ = fVar85 * fVar57 + fVar106 * fVar65 + fVar101 * fVar9 + fVar97 * fVar13;
    auVar68._4_4_ = fVar85 * fVar61 + fVar106 * fVar70 + fVar101 * fVar10 + fVar97 * fVar14;
    auVar68._8_4_ = fVar85 * fVar62 + fVar106 * fVar71 + fVar101 * fVar11 + fVar97 * fVar15;
    auVar68._12_4_ = fVar85 * fVar63 + fVar106 * fVar72 + fVar101 * fVar12 + fVar97 * fVar16;
    auVar73._0_4_ = fVar92 * fVar57 + fVar108 * fVar65 + fVar103 * fVar9 + fVar99 * fVar13;
    auVar73._4_4_ = fVar92 * fVar61 + fVar108 * fVar70 + fVar103 * fVar10 + fVar99 * fVar14;
    auVar73._8_4_ = fVar92 * fVar62 + fVar108 * fVar71 + fVar103 * fVar11 + fVar99 * fVar15;
    auVar73._12_4_ = fVar92 * fVar63 + fVar108 * fVar72 + fVar103 * fVar12 + fVar99 * fVar16;
    fVar48 = fVar94 * fVar57 + fVar109 * fVar65 + fVar104 * fVar9 + fVar100 * fVar13;
    fVar54 = fVar94 * fVar61 + fVar109 * fVar70 + fVar104 * fVar10 + fVar100 * fVar14;
    auVar79._4_4_ = fVar54;
    auVar79._0_4_ = fVar48;
    fVar55 = fVar94 * fVar62 + fVar109 * fVar71 + fVar104 * fVar11 + fVar100 * fVar15;
    fVar56 = fVar94 * fVar63 + fVar109 * fVar72 + fVar104 * fVar12 + fVar100 * fVar16;
    fVar27 = fVar57 * fVar75 + fVar65 * fVar110 + fVar9 * fVar105 + fVar13 * fVar77;
    fVar35 = fVar61 * fVar75 + fVar70 * fVar110 + fVar10 * fVar105 + fVar14 * fVar77;
    fVar37 = fVar62 * fVar75 + fVar71 * fVar110 + fVar11 * fVar105 + fVar15 * fVar77;
    fVar39 = fVar63 * fVar75 + fVar72 * fVar110 + fVar12 * fVar105 + fVar16 * fVar77;
    lVar5 = lVar19 * 4;
    fVar57 = *(float *)(bezier_basis0 + lVar5 + 0x13ec);
    fVar61 = *(float *)(bezier_basis0 + lVar5 + 0x13f0);
    fVar62 = *(float *)(bezier_basis0 + lVar5 + 0x13f4);
    fVar63 = *(float *)(bezier_basis0 + lVar5 + 0x13f8);
    lVar5 = lVar19 * 4;
    fVar65 = *(float *)(bezier_basis0 + lVar5 + 0x1870);
    fVar70 = *(float *)(bezier_basis0 + lVar5 + 0x1874);
    fVar71 = *(float *)(bezier_basis0 + lVar5 + 0x1878);
    fVar72 = *(float *)(bezier_basis0 + lVar5 + 0x187c);
    lVar5 = lVar19 * 4;
    fVar9 = *(float *)(bezier_basis0 + lVar5 + 0x1cf4);
    fVar10 = *(float *)(bezier_basis0 + lVar5 + 0x1cf8);
    fVar11 = *(float *)(bezier_basis0 + lVar5 + 0x1cfc);
    fVar12 = *(float *)(bezier_basis0 + lVar5 + 0x1d00);
    lVar5 = lVar19 * 4;
    fVar13 = *(float *)(bezier_basis0 + lVar5 + 0x2178);
    fVar14 = *(float *)(bezier_basis0 + lVar5 + 0x217c);
    fVar15 = *(float *)(bezier_basis0 + lVar5 + 0x2180);
    fVar16 = *(float *)(bezier_basis0 + lVar5 + 0x2184);
    fVar78 = fVar85 * fVar57 + fVar106 * fVar65 + fVar101 * fVar9 + fVar97 * fVar13;
    fVar82 = fVar85 * fVar61 + fVar106 * fVar70 + fVar101 * fVar10 + fVar97 * fVar14;
    fVar83 = fVar85 * fVar62 + fVar106 * fVar71 + fVar101 * fVar11 + fVar97 * fVar15;
    fVar84 = fVar85 * fVar63 + fVar106 * fVar72 + fVar101 * fVar12 + fVar97 * fVar16;
    fVar20 = fVar92 * fVar57 + fVar108 * fVar65 + fVar103 * fVar9 + fVar99 * fVar13;
    fVar24 = fVar92 * fVar61 + fVar108 * fVar70 + fVar103 * fVar10 + fVar99 * fVar14;
    fVar25 = fVar92 * fVar62 + fVar108 * fVar71 + fVar103 * fVar11 + fVar99 * fVar15;
    fVar26 = fVar92 * fVar63 + fVar108 * fVar72 + fVar103 * fVar12 + fVar99 * fVar16;
    fVar111 = fVar94 * fVar57 + fVar109 * fVar65 + fVar104 * fVar9 + fVar100 * fVar13;
    fVar113 = fVar94 * fVar61 + fVar109 * fVar70 + fVar104 * fVar10 + fVar100 * fVar14;
    fVar114 = fVar94 * fVar62 + fVar109 * fVar71 + fVar104 * fVar11 + fVar100 * fVar15;
    fVar115 = fVar94 * fVar63 + fVar109 * fVar72 + fVar104 * fVar12 + fVar100 * fVar16;
    fVar57 = fVar57 * fVar75 + fVar65 * fVar110 + fVar9 * fVar105 + fVar13 * fVar77;
    fVar61 = fVar61 * fVar75 + fVar70 * fVar110 + fVar10 * fVar105 + fVar14 * fVar77;
    fVar62 = fVar62 * fVar75 + fVar71 * fVar110 + fVar11 * fVar105 + fVar15 * fVar77;
    fVar63 = fVar63 * fVar75 + fVar72 * fVar110 + fVar12 * fVar105 + fVar16 * fVar77;
    uVar86 = -(uint)(uVar18 == 0);
    uVar93 = -(uint)(uVar18 == 1);
    uVar95 = -(uint)(uVar18 == 2);
    uVar96 = -(uint)(uVar18 == 3);
    uVar28 = -(uint)(uVar18 == 7);
    uVar36 = -(uint)(uVar18 == 6);
    uVar38 = -(uint)(uVar18 == 5);
    uVar40 = -(uint)(uVar18 == 4);
    fVar65 = (float)(~uVar28 & (uint)fVar78) * 0.055555556 + auVar68._0_4_;
    fVar70 = (float)(~uVar36 & (uint)fVar82) * 0.055555556 + auVar68._4_4_;
    fVar71 = (float)(~uVar38 & (uint)fVar83) * 0.055555556 + auVar68._8_4_;
    fVar72 = (float)(~uVar40 & (uint)fVar84) * 0.055555556 + auVar68._12_4_;
    auVar66 = minps(local_218,auVar68);
    auVar67 = maxps(local_208,auVar68);
    auVar76._0_8_ =
         CONCAT44(auVar68._4_4_ - (float)(~uVar93 & (uint)fVar82) * 0.055555556,
                  auVar68._0_4_ - (float)(~uVar86 & (uint)fVar78) * 0.055555556);
    auVar76._8_4_ = auVar68._8_4_ - (float)(~uVar95 & (uint)fVar83) * 0.055555556;
    auVar76._12_4_ = auVar68._12_4_ - (float)(~uVar96 & (uint)fVar84) * 0.055555556;
    auVar107._0_4_ = (float)(~uVar28 & (uint)fVar20) * 0.055555556 + auVar73._0_4_;
    auVar107._4_4_ = (float)(~uVar36 & (uint)fVar24) * 0.055555556 + auVar73._4_4_;
    auVar107._8_4_ = (float)(~uVar38 & (uint)fVar25) * 0.055555556 + auVar73._8_4_;
    auVar107._12_4_ = (float)(~uVar40 & (uint)fVar26) * 0.055555556 + auVar73._12_4_;
    auVar68 = minps(local_1e8,auVar73);
    auVar21 = maxps(local_1f8,auVar73);
    auVar74._0_8_ =
         CONCAT44(auVar73._4_4_ - (float)(~uVar93 & (uint)fVar24) * 0.055555556,
                  auVar73._0_4_ - (float)(~uVar86 & (uint)fVar20) * 0.055555556);
    auVar74._8_4_ = auVar73._8_4_ - (float)(~uVar95 & (uint)fVar25) * 0.055555556;
    auVar74._12_4_ = auVar73._12_4_ - (float)(~uVar96 & (uint)fVar26) * 0.055555556;
    auVar79._8_4_ = fVar55;
    auVar79._12_4_ = fVar56;
    auVar102._0_4_ = (float)(~uVar28 & (uint)fVar111) * 0.055555556 + fVar48;
    auVar102._4_4_ = (float)(~uVar36 & (uint)fVar113) * 0.055555556 + fVar54;
    auVar102._8_4_ = (float)(~uVar38 & (uint)fVar114) * 0.055555556 + fVar55;
    auVar102._12_4_ = (float)(~uVar40 & (uint)fVar115) * 0.055555556 + fVar56;
    auVar41._4_4_ = uStack_1d4;
    auVar41._0_4_ = local_1d8;
    auVar41._8_4_ = uStack_1d0;
    auVar41._12_4_ = uStack_1cc;
    auVar49 = minps(auVar41,auVar79);
    auVar79 = maxps(local_1c8,auVar79);
    auVar64._0_8_ =
         CONCAT44(fVar54 - (float)(~uVar93 & (uint)fVar113) * 0.055555556,
                  fVar48 - (float)(~uVar86 & (uint)fVar111) * 0.055555556);
    auVar64._8_4_ = fVar55 - (float)(~uVar95 & (uint)fVar114) * 0.055555556;
    auVar64._12_4_ = fVar56 - (float)(~uVar96 & (uint)fVar115) * 0.055555556;
    auVar112._4_4_ = fVar35;
    auVar112._0_4_ = fVar27;
    auVar112._8_4_ = fVar37;
    auVar112._12_4_ = fVar39;
    auVar52._0_8_ =
         CONCAT44((float)(~uVar36 & (uint)fVar61) * 0.055555556 + fVar35,
                  (float)(~uVar28 & (uint)fVar57) * 0.055555556 + fVar27);
    auVar52._8_4_ = (float)(~uVar38 & (uint)fVar62) * 0.055555556 + fVar37;
    auVar52._12_4_ = (float)(~uVar40 & (uint)fVar63) * 0.055555556 + fVar39;
    auVar80._8_4_ = auVar52._8_4_;
    auVar80._0_8_ = auVar52._0_8_;
    auVar80._12_4_ = auVar52._12_4_;
    auVar88._4_4_ = uStack_1b4;
    auVar88._0_4_ = local_1b8;
    auVar88._8_4_ = uStack_1b0;
    auVar88._12_4_ = uStack_1ac;
    auVar41 = minps(auVar88,auVar112);
    auVar112 = maxps(auVar98,auVar112);
    auVar58._0_8_ =
         CONCAT44(fVar35 - (float)(~uVar93 & (uint)fVar61) * 0.055555556,
                  fVar27 - (float)(~uVar86 & (uint)fVar57) * 0.055555556);
    auVar58._8_4_ = fVar37 - (float)(~uVar95 & (uint)fVar62) * 0.055555556;
    auVar58._12_4_ = fVar39 - (float)(~uVar96 & (uint)fVar63) * 0.055555556;
    auVar87._8_4_ = auVar76._8_4_;
    auVar87._0_8_ = auVar76._0_8_;
    auVar87._12_4_ = auVar76._12_4_;
    auVar69._4_4_ = fVar70;
    auVar69._0_4_ = fVar65;
    auVar69._8_4_ = fVar71;
    auVar69._12_4_ = fVar72;
    auVar88 = minps(auVar87,auVar69);
    auVar66 = minps(auVar66,auVar88);
    auVar89._8_4_ = auVar74._8_4_;
    auVar89._0_8_ = auVar74._0_8_;
    auVar89._12_4_ = auVar74._12_4_;
    auVar88 = minps(auVar89,auVar107);
    auVar69 = minps(auVar68,auVar88);
    auVar90._8_4_ = auVar64._8_4_;
    auVar90._0_8_ = auVar64._0_8_;
    auVar90._12_4_ = auVar64._12_4_;
    auVar88 = minps(auVar90,auVar102);
    auVar88 = minps(auVar49,auVar88);
    auVar91._8_4_ = auVar58._8_4_;
    auVar91._0_8_ = auVar58._0_8_;
    auVar91._12_4_ = auVar58._12_4_;
    auVar49 = minps(auVar91,auVar80);
    auVar41 = minps(auVar41,auVar49);
    auVar81._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar18 ^ 0x80000000));
    auVar81._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar18 ^ 0x80000000));
    auVar81._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar18 ^ 0x80000000));
    auVar81._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar18 ^ 0x80000000));
    local_218 = local_218 & auVar81 | ~auVar81 & auVar66;
    auVar66._0_4_ = local_1e8._0_4_ & auVar81._0_4_;
    auVar66._4_4_ = local_1e8._4_4_ & auVar81._4_4_;
    auVar66._8_4_ = local_1e8._8_4_ & auVar81._8_4_;
    auVar66._12_4_ = local_1e8._12_4_ & auVar81._12_4_;
    local_1e8 = auVar66 | ~auVar81 & auVar69;
    local_1d8 = local_1d8 & auVar81._0_4_ | ~auVar81._0_4_ & auVar88._0_4_;
    uStack_1d4 = uStack_1d4 & auVar81._4_4_ | ~auVar81._4_4_ & auVar88._4_4_;
    uStack_1d0 = uStack_1d0 & auVar81._8_4_ | ~auVar81._8_4_ & auVar88._8_4_;
    uStack_1cc = uStack_1cc & auVar81._12_4_ | ~auVar81._12_4_ & auVar88._12_4_;
    local_1b8 = local_1b8 & auVar81._0_4_ | ~auVar81._0_4_ & auVar41._0_4_;
    uStack_1b4 = uStack_1b4 & auVar81._4_4_ | ~auVar81._4_4_ & auVar41._4_4_;
    uStack_1b0 = uStack_1b0 & auVar81._8_4_ | ~auVar81._8_4_ & auVar41._8_4_;
    uStack_1ac = uStack_1ac & auVar81._12_4_ | ~auVar81._12_4_ & auVar41._12_4_;
    auVar49._4_4_ = fVar70;
    auVar49._0_4_ = fVar65;
    auVar49._8_4_ = fVar71;
    auVar49._12_4_ = fVar72;
    auVar41 = maxps(auVar76,auVar49);
    auVar41 = maxps(auVar67,auVar41);
    auVar88 = maxps(auVar74,auVar107);
    auVar88 = maxps(auVar21,auVar88);
    auVar69 = maxps(auVar64,auVar102);
    auVar69 = maxps(auVar79,auVar69);
    auVar49 = maxps(auVar58,auVar52);
    auVar49 = maxps(auVar112,auVar49);
    local_208._0_4_ = local_208._0_4_ & auVar81._0_4_ | ~auVar81._0_4_ & auVar41._0_4_;
    local_208._4_4_ = local_208._4_4_ & auVar81._4_4_ | ~auVar81._4_4_ & auVar41._4_4_;
    local_208._8_4_ = local_208._8_4_ & auVar81._8_4_ | ~auVar81._8_4_ & auVar41._8_4_;
    local_208._12_4_ = local_208._12_4_ & auVar81._12_4_ | ~auVar81._12_4_ & auVar41._12_4_;
    local_1f8._0_4_ = local_1f8._0_4_ & auVar81._0_4_ | ~auVar81._0_4_ & auVar88._0_4_;
    local_1f8._4_4_ = local_1f8._4_4_ & auVar81._4_4_ | ~auVar81._4_4_ & auVar88._4_4_;
    local_1f8._8_4_ = local_1f8._8_4_ & auVar81._8_4_ | ~auVar81._8_4_ & auVar88._8_4_;
    local_1f8._12_4_ = local_1f8._12_4_ & auVar81._12_4_ | ~auVar81._12_4_ & auVar88._12_4_;
    uVar18 = local_1c8._0_4_ & auVar81._0_4_ | ~auVar81._0_4_ & auVar69._0_4_;
    uVar28 = local_1c8._4_4_ & auVar81._4_4_ | ~auVar81._4_4_ & auVar69._4_4_;
    uVar36 = local_1c8._8_4_ & auVar81._8_4_ | ~auVar81._8_4_ & auVar69._8_4_;
    local_1c8._12_4_ = local_1c8._12_4_ & auVar81._12_4_ | ~auVar81._12_4_ & auVar69._12_4_;
    local_1c8._4_4_ = uVar28;
    local_1c8._0_4_ = uVar18;
    local_1c8._8_4_ = uVar36;
    local_f8 = auVar98._0_4_;
    uStack_f4 = auVar98._4_4_;
    uStack_f0 = auVar98._8_4_;
    uStack_ec = auVar98._12_4_;
    auVar21._0_4_ = local_f8 & auVar81._0_4_;
    auVar21._4_4_ = uStack_f4 & auVar81._4_4_;
    auVar21._8_4_ = uStack_f0 & auVar81._8_4_;
    auVar21._12_4_ = uStack_ec & auVar81._12_4_;
    auVar98._4_4_ = ~auVar81._4_4_ & auVar49._4_4_;
    auVar98._0_4_ = ~auVar81._0_4_ & auVar49._0_4_;
    auVar98._8_4_ = ~auVar81._8_4_ & auVar49._8_4_;
    auVar98._12_4_ = ~auVar81._12_4_ & auVar49._12_4_;
    auVar98 = auVar98 | auVar21;
    lVar19 = lVar19 + 4;
  } while (lVar19 == 4);
  auVar22._4_4_ = local_218._0_4_;
  auVar22._0_4_ = local_218._4_4_;
  auVar22._8_4_ = local_218._12_4_;
  auVar22._12_4_ = local_218._8_4_;
  auVar41 = minps(auVar22,local_218);
  auVar29._0_8_ = auVar41._8_8_;
  auVar29._8_4_ = auVar41._0_4_;
  auVar29._12_4_ = auVar41._4_4_;
  auVar88 = minps(auVar29,auVar41);
  auVar42._4_4_ = local_1e8._0_4_;
  auVar42._0_4_ = local_1e8._4_4_;
  auVar42._8_4_ = local_1e8._12_4_;
  auVar42._12_4_ = local_1e8._8_4_;
  auVar41 = minps(auVar42,local_1e8);
  auVar23._0_8_ = auVar41._8_8_;
  auVar23._8_4_ = auVar41._0_4_;
  auVar23._12_4_ = auVar41._4_4_;
  auVar41 = minps(auVar23,auVar41);
  auVar67._4_4_ = uStack_1d4;
  auVar67._0_4_ = local_1d8;
  auVar67._8_4_ = uStack_1d0;
  auVar67._12_4_ = uStack_1cc;
  auVar30._4_4_ = local_1d8;
  auVar30._0_4_ = uStack_1d4;
  auVar30._8_4_ = uStack_1cc;
  auVar30._12_4_ = uStack_1d0;
  auVar69 = minps(auVar30,auVar67);
  auVar43._0_8_ = auVar69._8_8_;
  auVar43._8_4_ = auVar69._0_4_;
  auVar43._12_4_ = auVar69._4_4_;
  auVar49 = minps(auVar43,auVar69);
  auVar31._4_4_ = local_208._0_4_;
  auVar31._0_4_ = local_208._4_4_;
  auVar31._8_4_ = local_208._12_4_;
  auVar31._12_4_ = local_208._8_4_;
  auVar69 = maxps(auVar31,local_208);
  auVar44._0_8_ = auVar69._8_8_;
  auVar44._8_4_ = auVar69._0_4_;
  auVar44._12_4_ = auVar69._4_4_;
  auVar112 = maxps(auVar44,auVar69);
  auVar50._4_4_ = local_1f8._0_4_;
  auVar50._0_4_ = local_1f8._4_4_;
  auVar50._8_4_ = local_1f8._12_4_;
  auVar50._12_4_ = local_1f8._8_4_;
  auVar69 = maxps(auVar50,local_1f8);
  auVar32._0_8_ = auVar69._8_8_;
  auVar32._8_4_ = auVar69._0_4_;
  auVar32._12_4_ = auVar69._4_4_;
  auVar69 = maxps(auVar32,auVar69);
  auVar45._4_4_ = uVar18;
  auVar45._0_4_ = uVar28;
  auVar45._8_4_ = local_1c8._12_4_;
  auVar45._12_4_ = uVar36;
  auVar21 = maxps(auVar45,local_1c8);
  auVar51._0_8_ = auVar21._8_8_;
  auVar51._8_4_ = auVar21._0_4_;
  auVar51._12_4_ = auVar21._4_4_;
  auVar52 = maxps(auVar51,auVar21);
  auVar17._4_4_ = uStack_1b4;
  auVar17._0_4_ = local_1b8;
  auVar17._8_4_ = uStack_1b0;
  auVar17._12_4_ = uStack_1ac;
  auVar46._4_4_ = local_1b8;
  auVar46._0_4_ = uStack_1b4;
  auVar46._8_4_ = uStack_1ac;
  auVar46._12_4_ = uStack_1b0;
  auVar21 = minps(auVar46,auVar17);
  auVar53._0_8_ = auVar21._8_8_;
  auVar53._8_4_ = auVar21._0_4_;
  auVar53._12_4_ = auVar21._4_4_;
  auVar21 = minps(auVar53,auVar21);
  auVar59._4_4_ = auVar98._0_4_;
  auVar59._0_4_ = auVar98._4_4_;
  auVar59._8_4_ = auVar98._12_4_;
  auVar59._12_4_ = auVar98._8_4_;
  auVar98 = maxps(auVar59,auVar98);
  auVar47._0_8_ = auVar98._8_8_;
  auVar47._8_4_ = auVar98._0_4_;
  auVar47._12_4_ = auVar98._4_4_;
  auVar98 = maxps(auVar47,auVar98);
  fVar105 = ABS(auVar98._0_4_);
  if (ABS(auVar98._0_4_) <= ABS(auVar21._0_4_)) {
    fVar105 = ABS(auVar21._0_4_);
  }
  fVar77 = auVar88._0_4_ - fVar105;
  fVar100 = auVar41._0_4_ - fVar105;
  fVar101 = auVar49._0_4_ - fVar105;
  fVar103 = fVar105 + auVar112._0_4_;
  fVar104 = fVar105 + auVar69._0_4_;
  fVar109 = fVar105 + auVar52._0_4_;
  auVar33._0_8_ = CONCAT44(fVar100,fVar77) & 0x7fffffff7fffffff;
  auVar33._8_4_ = ABS(fVar101);
  auVar33._12_4_ = ABS(0.0 - fVar105);
  auVar60._0_8_ = CONCAT44(fVar104,fVar103) & 0x7fffffff7fffffff;
  auVar60._8_4_ = ABS(fVar109);
  auVar60._12_4_ = ABS(fVar105 + 0.0);
  auVar98 = maxps(auVar33,auVar60);
  fVar75 = auVar98._4_4_;
  if (auVar98._4_4_ <= auVar98._0_4_) {
    fVar75 = auVar98._0_4_;
  }
  auVar34._8_8_ = auVar98._8_8_;
  auVar34._0_8_ = auVar98._8_8_;
  if (auVar98._8_4_ <= fVar75) {
    auVar34._0_4_ = fVar75;
  }
  fVar75 = auVar34._0_4_ * 4.7683716e-07;
  (__return_storage_ptr__->lower).field_0.m128[0] = fVar77 - fVar75;
  (__return_storage_ptr__->lower).field_0.m128[1] = fVar100 - fVar75;
  (__return_storage_ptr__->lower).field_0.m128[2] = fVar101 - fVar75;
  (__return_storage_ptr__->lower).field_0.m128[3] = (0.0 - fVar105) - fVar75;
  (__return_storage_ptr__->upper).field_0.m128[0] = fVar75 + fVar103;
  (__return_storage_ptr__->upper).field_0.m128[1] = fVar75 + fVar104;
  (__return_storage_ptr__->upper).field_0.m128[2] = fVar75 + fVar109;
  (__return_storage_ptr__->upper).field_0.m128[3] = fVar75 + fVar105 + 0.0;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const LinearSpace3fa& space, size_t i) const {
        return bounds(space,i);
      }